

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetree.c
# Opt level: O3

nodetree * FindChild(nodetree *p,tchar_t *Name)

{
  nodetree *pnVar1;
  tchar_t *b;
  nodetree *pnVar2;
  nodetree *p_00;
  bool bVar3;
  
  p_00 = p->Children;
  while( true ) {
    if (p_00 == (nodetree *)0x0) {
      return (nodetree *)0x0;
    }
    b = (tchar_t *)Node_GetData(&p_00->Base,5,4);
    if (b == (tchar_t *)0x0) {
      pnVar2 = (nodetree *)(**(code **)((long)(p_00->Base).VMT + 0x68))(p_00,Name);
      pnVar1 = pnVar2;
    }
    else {
      pnVar2 = (nodetree *)tcsisame_ascii(Name,b);
      pnVar1 = p_00;
    }
    if (pnVar2 != (nodetree *)0x0) break;
    bVar3 = p_00 == p_00->Next;
    p_00 = p_00->Next;
    if (bVar3) {
      __assert_fail("(nodetree*)(p) != ((nodetree*)(p))->Next",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                    ,0x8a,"nodetree *FindChild(nodetree *, const tchar_t *)");
    }
  }
  return pnVar1;
}

Assistant:

static nodetree* FindChild(nodetree* p, const tchar_t* Name)
{
    nodetree* Result;
    for (p=NodeTree_Children(p);p;p=NodeTree_Next(p))
    {
        const tchar_t* s = Node_GetData((node*)p,NODE_ID,TYPE_STRING);
        if (s)
        {
            if (tcsisame_ascii(Name,s))
                return p;
        }
        else
        if ((Result = NodeTree_FindChild(p,Name))!=NULL)
            return Result;
    }
    return NULL;
}